

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O0

bool __thiscall FormatTypeHFE::CanLoad(FormatTypeHFE *this,char *file_path)

{
  long local_29;
  uchar header [8];
  bool can_load;
  FILE *file;
  char *file_path_local;
  FormatTypeHFE *this_local;
  
  header[0] = '\0';
  register0x00000000 = fopen(file_path,"rb");
  if (register0x00000000 != (FILE *)0x0) {
    memset(&local_29,0,8);
    fread(&local_29,1,8,stack0xffffffffffffffe0);
    if (local_29 == 0x4546434950435848) {
      header[0] = '\x01';
    }
    fclose(stack0xffffffffffffffe0);
  }
  return (bool)(header[0] & 1);
}

Assistant:

bool FormatTypeHFE::CanLoad(const char* file_path)
{
   // Check HXCPICFE version 
   FILE* file;
   bool can_load = false;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      // Check for type of file from header
      unsigned char header[0x8] = {0};
      // check the 22 first char
      fread(header, 1, 0x8, file);
      if (memcmp(header, "HXCPICFE", 8) == 0)
      {
         can_load = true;
      }
      fclose(file);
   }
   return can_load;
}